

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromCollations(CollationLoader *this,UErrorCode *errorCode)

{
  Locale *this_00;
  char *inKey;
  uint uVar1;
  int iVar2;
  int iVar3;
  UResourceBundle *p;
  LocalPointerBase<UResourceBundle> resourceBundle;
  size_t sVar4;
  CollationCacheEntry *pCVar5;
  char *pcVar6;
  char *pcVar7;
  LocalUResourceBundlePointer localData;
  Locale local_110;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  inKey = this->type;
  pcVar7 = inKey;
  resourceBundle.ptr =
       ures_getByKeyWithFallback_63(this->collations,inKey,(UResourceBundle *)0x0,errorCode);
  localData.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)resourceBundle.ptr;
  if (*errorCode != U_MISSING_RESOURCE_ERROR) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      localData.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)(UResourceBundle *)0x0;
      this->data = resourceBundle.ptr;
      pcVar7 = ures_getLocaleByType_63(resourceBundle.ptr,ULOC_ACTUAL_LOCALE,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        this_00 = &this->validLocale;
        pcVar6 = Locale::getBaseName(this_00);
        iVar2 = strcmp(pcVar7,pcVar6);
        iVar3 = strcmp(inKey,this->defaultType);
        if ((iVar3 == 0) ||
           (Locale::setKeywordValue(this_00,"collation",inKey,errorCode),
           *errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
          if ((*pcVar7 == '\0') || (iVar3 = strcmp(pcVar7,"root"), iVar3 == 0)) {
            pcVar6 = "standard";
            iVar3 = bcmp(inKey,"standard",9);
            if (iVar3 == 0) {
              if (this->typeFallback != '\0') {
                *errorCode = U_USING_DEFAULT_WARNING;
              }
              pCVar5 = makeCacheEntryFromRoot(this,(Locale *)pcVar6,errorCode);
              goto LAB_002270cc;
            }
          }
          Locale::Locale(&local_110,pcVar7,(char *)0x0,(char *)0x0,(char *)0x0);
          Locale::operator=(&this->locale,&local_110);
          Locale::~Locale(&local_110);
          if (iVar2 == 0) {
            pCVar5 = loadFromData(this,errorCode);
          }
          else {
            Locale::setKeywordValue(&this->locale,"collation",inKey,errorCode);
            pCVar5 = getCacheEntry(this,errorCode);
            pCVar5 = makeCacheEntry(this_00,pCVar5,errorCode);
          }
          goto LAB_002270cc;
        }
      }
    }
    pCVar5 = (CollationCacheEntry *)0x0;
    goto LAB_002270cc;
  }
  sVar4 = strlen(inKey);
  *errorCode = U_USING_DEFAULT_WARNING;
  this->typeFallback = '\x01';
  uVar1 = this->typesTried;
  if (((uVar1 & 1) == 0) && (6 < (int)sVar4)) {
    pcVar7 = "search";
    iVar2 = bcmp(inKey,"search",6);
    if (iVar2 != 0) goto LAB_00227016;
    this->typesTried = uVar1 | 1;
    this->type[6] = '\0';
  }
  else {
LAB_00227016:
    if ((uVar1 & 2) == 0) {
      this->typesTried = uVar1 | 2;
      strcpy(inKey,this->defaultType);
    }
    else {
      if ((uVar1 & 4) != 0) {
        pCVar5 = makeCacheEntryFromRoot(this,(Locale *)pcVar7,errorCode);
        goto LAB_002270cc;
      }
      this->typesTried = uVar1 | 4;
      builtin_strncpy(inKey,"standard",9);
    }
  }
  Locale::setKeywordValue(&this->locale,"collation",inKey,errorCode);
  pCVar5 = getCacheEntry(this,errorCode);
LAB_002270cc:
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&localData);
  return pCVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}